

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_magestaff.cpp
# Opt level: O0

PalEntry __thiscall AMWeapBloodscourge::GetBlend(AMWeapBloodscourge *this)

{
  uint uVar1;
  AMWeapBloodscourge *this_local;
  
  uVar1 = FIntCVar::operator_cast_to_int(&paletteflash);
  if ((uVar1 & 1) == 0) {
    PalEntry::PalEntry((PalEntry *)((long)&this_local + 4),
                       (BYTE)(((uint)(byte)(this->super_AMageWeapon).super_AWeapon.field_0x582 << 7)
                             / 3),0x97,'n','\0');
  }
  else if ((this->super_AMageWeapon).super_AWeapon.field_0x582 == '\x03') {
    PalEntry::PalEntry((PalEntry *)((long)&this_local + 4),0x80,'d','I','\0');
  }
  else if ((this->super_AMageWeapon).super_AWeapon.field_0x582 == '\x02') {
    PalEntry::PalEntry((PalEntry *)((long)&this_local + 4),0x80,'}','\\','\0');
  }
  else if ((this->super_AMageWeapon).super_AWeapon.field_0x582 == '\x01') {
    PalEntry::PalEntry((PalEntry *)((long)&this_local + 4),0x80,0x96,'n','\0');
  }
  else {
    PalEntry::PalEntry((PalEntry *)((long)&this_local + 4),'\0','\0','\0','\0');
  }
  return (anon_union_4_2_12391d7c_for_PalEntry_0)
         (anon_union_4_2_12391d7c_for_PalEntry_0)this_local._4_4_;
}

Assistant:

PalEntry GetBlend ()
	{
		if (paletteflash & PF_HEXENWEAPONS)
		{
			if (MStaffCount == 3)
				return PalEntry(128, 100, 73, 0);
			else if (MStaffCount == 2)
				return PalEntry(128, 125, 92, 0);
			else if (MStaffCount == 1)
				return PalEntry(128, 150, 110, 0);
			else
				return PalEntry(0, 0, 0, 0);
		}
		else
		{
			return PalEntry (MStaffCount * 128 / 3, 151, 110, 0);
		}
	}